

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8CPSPointerQualifierTest20<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section8CPSPointerQualifierTest20<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  
  PkitsTestInfo::PkitsTestInfo(&info);
  info.test_number = "4.8.20";
  info.should_validate = true;
  PkitsTestInfo::SetInitialPolicySet(&info,"NIST-test-policy-1");
  PkitsTestInfo::SetInitialExplicitPolicy(&info,true);
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b6380,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b63a0,
             &info.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&info);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8CPSPointerQualifierTest20) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "CPSPointerQualifierTest20EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.20";
  info.should_validate = true;
  info.SetInitialPolicySet("NIST-test-policy-1");
  info.SetInitialExplicitPolicy(true);

  this->RunTest(certs, crls, info);
}